

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::serializeFilters
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *container)

{
  pointer pbVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filter;
  pointer pbVar3;
  ReusableStringStream oss;
  
  ReusableStringStream::ReusableStringStream(&oss);
  pbVar1 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar3 = (container->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    if (!bVar2) {
      std::operator<<(oss.m_oss,' ');
    }
    std::operator<<(oss.m_oss,(string *)pbVar3);
    bVar2 = false;
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string serializeFilters(std::vector<std::string> const &container) {
    ReusableStringStream oss;
    bool first = true;
    for (auto &&filter : container) {
      if (!first)
        oss << ' ';
      else
        first = false;

      oss << filter;
    }
    return oss.str();
  }